

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsat.cpp
# Opt level: O1

ostream * subsat::print_config(ostream *os)

{
  char local_9;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"subsat features:",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(os," VMTF",5);
  std::__ostream_insert<char,std::char_traits<char>>(os," VMTF_BUMP",10);
  std::__ostream_insert<char,std::char_traits<char>>(os," LIMITS",7);
  local_9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_9,1);
  return os;
}

Assistant:

std::ostream& subsat::print_config(std::ostream& os)
{
    os << "subsat features:";
    if (VDEBUG) { os << " DEBUG"; }
    if (SUBSAT_LOGGING_ENABLED) { os << " LOG"; }
    if (SUBSAT_RESTART) { os << " RESTART(" << SUBSAT_RESTART_INTERVAL << ")"; }
    if (SUBSAT_BLOCKING) { os << " BLOCKING"; }
    if (SUBSAT_VIRTUAL) { os << " VIRTUAL"; }
    if (SUBSAT_VDOM) { os << " VDOM"; }
    if (SUBSAT_VMTF) { os << " VMTF"; }
    if (SUBSAT_VMTF_BUMP) { os << " VMTF_BUMP"; }
    if (SUBSAT_STATISTICS) {
        os << " STATISTICS(level " << SUBSAT_STATISTICS;
#if defined(SUBSAT_STATISTICS_INTERVAL)
        os << ", interval " << SUBSAT_STATISTICS_INTERVAL;
#endif
        os << ")";
    }
    if (SUBSAT_LIMITS) { os << " LIMITS"; }
    if (VDEBUG && SUBSAT_EXPENSIVE_ASSERTIONS) { os << " EXPENSIVE_ASSERTIONS"; }
    os << '\n';
    return os;
}